

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myBucket.h
# Opt level: O0

bitcoin * __thiscall myBucket_chain<bitcoin>::getData(myBucket_chain<bitcoin> *this,myString *key)

{
  code *pcVar1;
  bool bVar2;
  myBucket<bitcoin> *this_00;
  myBucket<bitcoin> *dataNode;
  undefined1 local_48 [8];
  Iterator __end0;
  Iterator __begin0;
  linkedList<myBucket<bitcoin>_> *__range2;
  myString *key_local;
  myBucket_chain<bitcoin> *this_local;
  
  linkedList<myBucket<bitcoin>_>::begin((linkedList<myBucket<bitcoin>_> *)&__end0.currPtr);
  linkedList<myBucket<bitcoin>_>::end((linkedList<myBucket<bitcoin>_> *)local_48);
  do {
    bVar2 = linkedList<myBucket<bitcoin>_>::Iterator::operator!=
                      ((Iterator *)&__end0.currPtr,(Iterator *)local_48);
    if (!bVar2) {
      dataNode._0_4_ = 2;
LAB_001102f3:
      linkedList<myBucket<bitcoin>_>::Iterator::~Iterator((Iterator *)local_48);
      linkedList<myBucket<bitcoin>_>::Iterator::~Iterator((Iterator *)&__end0.currPtr);
      if ((int)dataNode != 1) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      return (bitcoin *)this_local;
    }
    this_00 = linkedList<myBucket<bitcoin>_>::Iterator::operator*((Iterator *)&__end0.currPtr);
    bVar2 = myBucket<bitcoin>::operator==(this_00,key);
    if (bVar2) {
      this_local = (myBucket_chain<bitcoin> *)myBucket<bitcoin>::get_data(this_00);
      dataNode._0_4_ = 1;
      goto LAB_001102f3;
    }
    linkedList<myBucket<bitcoin>_>::Iterator::operator++((Iterator *)&__end0.currPtr);
  } while( true );
}

Assistant:

T* getData(myString key)  {



        for (  auto &dataNode : myBucketList) { //dataNode : myBucket<T>
            if (dataNode == key){

                return dataNode.get_data();
            }

        }
        assert(1);//means that we didnt found the data that we were expecting
    }